

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

_Bool createTree(tree_t *tree,uint numLeaves,uint dataSize)

{
  _Bool _Var1;
  uint8_t *puVar2;
  bitset_word_t *pbVar3;
  ulong uVar4;
  bitset_word_t bVar5;
  int iVar6;
  bitset_word_t *pbVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  
  if (numLeaves == 0 || tree == (tree_t *)0x0) {
    return false;
  }
  uVar8 = (uint)(byte)-(char)LZCOUNT(numLeaves - 1);
  iVar6 = 2 << (uVar8 & 0x1f);
  iVar11 = -1 << (uVar8 & 0x1f);
  uVar8 = (numLeaves - 1) + iVar11 + iVar6;
  if (dataSize == 0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    puVar2 = (uint8_t *)calloc((ulong)uVar8,(ulong)dataSize);
  }
  uVar10 = (ulong)(uVar8 * 2);
  tree->nodes = puVar2;
  pbVar3 = (bitset_word_t *)calloc(uVar10 + 0x3f >> 6,8);
  tree->haveNodeExists = pbVar3;
  if ((dataSize == 0 || puVar2 != (uint8_t *)0x0) && (pbVar3 != (bitset_word_t *)0x0)) {
    tree->depth = 0x21 - LZCOUNT(numLeaves - 1);
    tree->dataSize = dataSize;
    tree->numNodes = uVar8;
    tree->numLeaves = numLeaves;
    if (numLeaves == 0x10) {
      *pbVar3 = 0x1555555555555555;
    }
    else {
      uVar9 = (ulong)((uVar8 - numLeaves) * 2);
      for (uVar4 = uVar9; (uVar4 < uVar10 && ((uVar4 & 0x3e) != 0)); uVar4 = uVar4 + 2) {
        pbVar3[uVar4 >> 6] = pbVar3[uVar4 >> 6] | 1L << ((uint)uVar4 & 0x3e);
      }
      pbVar7 = pbVar3 + (uVar4 >> 6);
      for (; uVar4 < (uVar8 * 2 & 0xffffffc0); uVar4 = uVar4 + 0x40) {
        *pbVar7 = 0x5555555555555555;
        pbVar7 = pbVar7 + 1;
      }
      for (; uVar4 < uVar10; uVar4 = uVar4 + 2) {
        pbVar3[uVar4 >> 6] = pbVar3[uVar4 >> 6] | 1L << ((byte)uVar4 & 0x3e);
      }
      uVar8 = (iVar11 + iVar6) * 2;
      for (; (int)uVar9 != 0; uVar9 = (ulong)((int)uVar9 - 2)) {
        bVar5 = exists(tree,uVar8 - 1);
        if (bVar5 == 0) {
          bVar5 = exists(tree,uVar8);
          if (bVar5 != 0) goto LAB_0011bebc;
        }
        else {
LAB_0011bebc:
          pbVar3[uVar9 >> 6] = pbVar3[uVar9 >> 6] | 1L << ((byte)uVar9 & 0x3e);
        }
        uVar8 = uVar8 - 2;
      }
      *(byte *)pbVar3 = (byte)*pbVar3 | 1;
    }
    _Var1 = true;
  }
  else {
    clearTree(tree);
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool createTree(tree_t* tree, unsigned int numLeaves, unsigned int dataSize) {
  if (!tree || !numLeaves) {
    return false;
  }

  unsigned int depth = ceil_log2(numLeaves) + 1;
  /* Num nodes in complete - number of missing leaves */
  unsigned int num_nodes = ((1 << depth) - 1) - ((1 << (depth - 1)) - numLeaves);

  tree->nodes = dataSize ? calloc(num_nodes, dataSize) : NULL;
  /* Depending on the number of leaves, the tree may not be complete */
  tree->haveNodeExists =
      calloc((2 * num_nodes + sizeof(bitset_word_t) * 8 - 1) / (sizeof(bitset_word_t) * 8),
             sizeof(bitset_word_t));
  if ((dataSize && !tree->nodes) || !tree->haveNodeExists) {
    clearTree(tree);
    return false;
  }

  tree->depth     = depth;
  tree->dataSize  = dataSize;
  tree->numNodes  = num_nodes;
  tree->numLeaves = numLeaves;

  initNodes(tree);
  return true;
}